

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O2

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::findIntersectionsInDescendants
          (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *this,Node *node,Node **value,
          vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
          *intersections)

{
  Node **ppNVar1;
  _Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  _Var2;
  Node *pNVar3;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *pQVar4;
  bool bVar5;
  Node **other;
  Node **__args_1;
  long lVar6;
  Box<float> local_58;
  Box<float> local_48;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *local_38;
  
  ppNVar1 = *(Node ***)&this[1].mBox.width;
  local_38 = this;
  for (__args_1 = *(Node ***)&this[1].mBox; pQVar4 = local_38, __args_1 != ppNVar1;
      __args_1 = __args_1 + 1) {
    _Var2.
    super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ._M_head_impl =
         (node->children)._M_elems[0]._M_t.
         super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
         ._M_t.
         super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
         .
         super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ;
    local_58._0_8_ =
         *(undefined8 *)
          _Var2.
          super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
          ._M_head_impl;
    local_58._8_8_ =
         *(undefined8 *)
          ((long)_Var2.
                 super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                 ._M_head_impl + 8);
    pNVar3 = *__args_1;
    local_48.left = (pNVar3->box).left;
    local_48.top = (pNVar3->box).top;
    local_48.width = (pNVar3->box).width;
    local_48.height = (pNVar3->box).height;
    bVar5 = Box<float>::intersects(&local_58,&local_48);
    if (bVar5) {
      std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
      emplace_back<Node*const&,Node*const&>
                ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)value,
                 (Node **)node,__args_1);
    }
  }
  lVar6._0_4_ = (local_38->mBox).left;
  lVar6._4_4_ = (local_38->mBox).top;
  if (lVar6 != 0) {
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
      findIntersectionsInDescendants
                (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                   **)((long)&(pQVar4->mBox).left + lVar6),node,value,intersections);
    }
  }
  return;
}

Assistant:

void findIntersectionsInDescendants(Node* node, const T& value, std::vector<std::pair<T, T>>& intersections) const
    {
        // Test against the values stored in this node
        for (const auto& other : node->values)
        {
            if (mGetBox(value).intersects(mGetBox(other)))
                intersections.emplace_back(value, other);
        }
        // Test against values stored into descendants of this node
        if (!isLeaf(node))
        {
            for (const auto& child : node->children)
                findIntersectionsInDescendants(child.get(), value, intersections);
        }
    }